

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O0

aiReturn aiGetMaterialString(aiMaterial *pMat,char *pKey,uint type,uint index,aiString *pOut)

{
  char *pcVar1;
  Logger *this;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  aiMaterialProperty *local_38;
  aiMaterialProperty *prop;
  aiString *pOut_local;
  uint index_local;
  uint type_local;
  char *pKey_local;
  aiMaterial *pMat_local;
  
  prop = (aiMaterialProperty *)pOut;
  pOut_local._0_4_ = index;
  pOut_local._4_4_ = type;
  _index_local = pKey;
  pKey_local = (char *)pMat;
  if (pOut == (aiString *)0x0) {
    __assert_fail("pOut != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                  ,0x128,
                  "aiReturn aiGetMaterialString(const aiMaterial *, const char *, unsigned int, unsigned int, aiString *)"
                 );
  }
  aiGetMaterialProperty(pMat,pKey,type,index,&local_38);
  if (local_38 == (aiMaterialProperty *)0x0) {
    pMat_local._4_4_ = aiReturn_FAILURE;
  }
  else if (local_38->mType == aiPTI_String) {
    if (local_38->mDataLength < 5) {
      __assert_fail("prop->mDataLength>=5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                    ,0x131,
                    "aiReturn aiGetMaterialString(const aiMaterial *, const char *, unsigned int, unsigned int, aiString *)"
                   );
    }
    (prop->mKey).length = *(ai_uint32 *)local_38->mData;
    if ((prop->mKey).length + 5 != local_38->mDataLength) {
      __assert_fail("pOut->length+1+4==prop->mDataLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                    ,0x136,
                    "aiReturn aiGetMaterialString(const aiMaterial *, const char *, unsigned int, unsigned int, aiString *)"
                   );
    }
    if (local_38->mData[local_38->mDataLength - 1] != '\0') {
      __assert_fail("!prop->mData[ prop->mDataLength - 1 ]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                    ,0x137,
                    "aiReturn aiGetMaterialString(const aiMaterial *, const char *, unsigned int, unsigned int, aiString *)"
                   );
    }
    memcpy((prop->mKey).data,local_38->mData + 4,(ulong)((prop->mKey).length + 1));
    pMat_local._4_4_ = aiReturn_SUCCESS;
  }
  else {
    this = Assimp::DefaultLogger::get();
    pcVar1 = _index_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,pcVar1,&local_99);
    std::operator+(&local_78,"Material property",&local_98);
    std::operator+(&local_58,&local_78," was found, but is no string");
    Assimp::Logger::error(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    pMat_local._4_4_ = aiReturn_FAILURE;
  }
  return pMat_local._4_4_;
}

Assistant:

aiReturn aiGetMaterialString(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    aiString* pOut)
{
    ai_assert (pOut != NULL);

    const aiMaterialProperty* prop;
    aiGetMaterialProperty(pMat,pKey,type,index,(const aiMaterialProperty**)&prop);
    if (!prop) {
        return AI_FAILURE;
    }

    if( aiPTI_String == prop->mType) {
        ai_assert(prop->mDataLength>=5);

        // The string is stored as 32 but length prefix followed by zero-terminated UTF8 data
        pOut->length = static_cast<unsigned int>(*reinterpret_cast<uint32_t*>(prop->mData));

        ai_assert( pOut->length+1+4==prop->mDataLength );
        ai_assert( !prop->mData[ prop->mDataLength - 1 ] );
        memcpy(pOut->data,prop->mData+4,pOut->length+1);
    }
    else {
        // TODO - implement lexical cast as well
        ASSIMP_LOG_ERROR("Material property" + std::string(pKey) +
            " was found, but is no string" );
        return AI_FAILURE;
    }
    return AI_SUCCESS;
}